

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIListBox::clear(CGUIListBox *this)

{
  vector<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_> local_28
  ;
  
  local_28.
  super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->Items).m_data.
       super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_28.
  super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->Items).m_data.
       super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->Items).m_data.
       super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->Items).m_data.
  super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Items).m_data.
  super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Items).m_data.
  super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>::
  ~vector(&local_28);
  (this->Items).is_sorted = true;
  this->ItemsIconWidth = 0;
  this->Selected = -1;
  (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2d])
            (this->ScrollBar,0);
  recalculateItemHeight(this);
  return;
}

Assistant:

void CGUIListBox::clear()
{
	Items.clear();
	ItemsIconWidth = 0;
	Selected = -1;

	ScrollBar->setPos(0);

	recalculateItemHeight();
}